

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variable.cpp
# Opt level: O0

void __thiscall Variable::Variable(Variable *this,Kind kind,string *type,int value,int tag)

{
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_28;
  int local_24;
  int tag_local;
  int value_local;
  string *type_local;
  Variable *pVStack_10;
  Kind kind_local;
  Variable *this_local;
  
  local_28 = tag;
  local_24 = value;
  _tag_local = type;
  type_local._4_4_ = kind;
  pVStack_10 = this;
  std::vector<int,_std::allocator<int>_>::vector(&this->arraySize);
  std::__cxx11::string::string((string *)&this->type);
  std::__cxx11::string::string((string *)&this->name);
  this->kind = type_local._4_4_;
  std::__cxx11::to_string(&local_68,local_28);
  std::operator+(&local_48,"literal_",&local_68);
  std::__cxx11::string::operator=((string *)&this->name,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  this->visibility = PRIVATE;
  std::__cxx11::string::operator=((string *)&this->type,(string *)type);
  this->value = local_24;
  this->dimensions = 0;
  this->offset = 0;
  this->size = 0;
  return;
}

Assistant:

Variable::Variable(Enums::Kind kind, std::string type, int value, int tag) {
    this->kind = kind;
    this->name = "literal_" + std::to_string(tag);
    this->visibility = Enums::Visibility::PRIVATE;
    this->type = std::move(type);
    this->value = value;
    this->dimensions = 0;
    this->offset = 0;
    this->size = 0;
}